

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latency_Coding_Lowpass_Example_Results.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  time_t tVar1;
  Clock *this;
  ANN *this_00;
  Parameters *param;
  Population *this_01;
  ArtificialPopulation *this_02;
  Population *this_03;
  Population *this_04;
  Population *this_05;
  LatencyEncodingSynapse_param *pLVar2;
  LatencyEncodingSynapse *this_06;
  LatencyDecodingSynapse_param *pLVar3;
  LatencyDecodingSynapse *this_07;
  LatencyEncodingSynapse *this_08;
  LatencyDecodingSynapse *this_09;
  Network_param *param_00;
  ostream *poVar4;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  Network n;
  string filterType;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filterType,"lowpass",(allocator<char> *)&n);
  if (argc == 0xb) {
    local_178 = atof(argv[1]);
    local_180 = atof(argv[2]);
    local_140 = atof(argv[3]);
    local_148 = atof(argv[4]);
    local_150 = atof(argv[5]);
    local_160 = atof(argv[6]);
    local_158 = atof(argv[7]);
    local_170 = atof(argv[8]);
    local_168 = atof(argv[9]);
    std::__cxx11::string::assign((char *)&filterType);
  }
  else {
    local_178 = 1.0;
    local_158 = 0.0;
    local_170 = 20.0;
    local_168 = 0.0001;
    local_160 = 0.0;
    local_150 = 0.0;
    local_148 = 0.0;
    local_140 = 0.0;
    local_180 = 0.0;
  }
  this = Clock::getInstance();
  Clock::setDt(this,local_168);
  this_00 = (ANN *)operator_new(0x40);
  ANN::ANN(this_00);
  ANN::setInputSize(this_00,1);
  std::__cxx11::string::string((string *)&local_50,(string *)&filterType);
  ANN::addLayer(this_00,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  param = (Parameters *)operator_new(0x58);
  *(undefined8 *)(param + 0x48) = 0;
  *(undefined8 *)(param + 0x50) = 0;
  *(double *)param = local_178;
  *(double *)(param + 8) = local_180;
  *(double *)(param + 0x10) = local_140;
  *(double *)(param + 0x18) = local_148;
  *(double *)(param + 0x20) = local_150;
  *(double *)(param + 0x28) = local_160;
  *(double *)(param + 0x30) = local_158;
  *(undefined8 *)(param + 0x38) = 0x3fc999999999999a;
  *(undefined8 *)(param + 0x40) = 0x3fe0000000000000;
  this_01 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"SignalGenerator",(allocator<char> *)&n);
  Population::Population(this_01,1,&local_70,param);
  std::__cxx11::string::~string((string *)&local_70);
  this_02 = (ArtificialPopulation *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this_02,this_00);
  this_03 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"iaf_psc_alpha",(allocator<char> *)&n);
  Population::Population(this_03,1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  this_04 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"iaf_psc_alpha",(allocator<char> *)&n);
  Population::Population(this_04,1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  this_05 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"PassThrough",(allocator<char> *)&n);
  Population::Population(this_05,1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  pLVar2 = (LatencyEncodingSynapse_param *)operator_new(8);
  pLVar2->window_length_s = local_170;
  this_06 = (LatencyEncodingSynapse *)operator_new(0x68);
  LatencyEncodingSynapse::LatencyEncodingSynapse(this_06,this_01,this_03,pLVar2);
  pLVar3 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  pLVar3->window_length_s = local_170;
  pLVar3->delay_s = 0.004;
  this_07 = (LatencyDecodingSynapse *)operator_new(0x68);
  LatencyDecodingSynapse::LatencyDecodingSynapse(this_07,this_03,(Population *)this_02,pLVar3);
  pLVar2 = (LatencyEncodingSynapse_param *)operator_new(8);
  pLVar2->window_length_s = local_170;
  this_08 = (LatencyEncodingSynapse *)operator_new(0x68);
  LatencyEncodingSynapse::LatencyEncodingSynapse(this_08,(Population *)this_02,this_04,pLVar2);
  pLVar3 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  pLVar3->window_length_s = local_170;
  pLVar3->delay_s = 0.003;
  this_09 = (LatencyDecodingSynapse *)operator_new(0x68);
  LatencyDecodingSynapse::LatencyDecodingSynapse(this_09,this_04,this_05,pLVar3);
  param_00 = (Network_param *)operator_new(8);
  param_00->dt = local_168;
  Network::Network(&n,param_00);
  Network::add(&n,(Synapse *)this_06);
  Network::add(&n,(Synapse *)this_07);
  Network::add(&n,(Synapse *)this_08);
  Network::add(&n,(Synapse *)this_09);
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  Network::run(&n,10.0);
  Network::~Network(&n);
  std::__cxx11::string::~string((string *)&filterType);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double window_length = 20;
    double dt = 0.0001;
    string filterType = "lowpass";
    if(argc == 11) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        window_length = atof(argv[8]);
        dt = atof(argv[9]);
        filterType = argv[10];
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, filterType);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/5.0;
    paramp1->offset = 0.5;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "iaf_psc_alpha");
    Population* p4 = new Population(1, "iaf_psc_alpha");
    Population* p5 = new Population(1, "PassThrough");

    // Synapses
    LatencyEncodingSynapse_param* params1 = new LatencyEncodingSynapse_param();
    params1->window_length_s = window_length;
    LatencyEncodingSynapse* s1 = new LatencyEncodingSynapse(p1, p3, params1);

    LatencyDecodingSynapse_param* params2 = new LatencyDecodingSynapse_param();
    params2->window_length_s = window_length;
    params2->delay_s = 0.004;
    LatencyDecodingSynapse* s2 = new LatencyDecodingSynapse(p3, p2, params2);

    // Synapses
    LatencyEncodingSynapse_param* params3 = new LatencyEncodingSynapse_param();
    params3->window_length_s = window_length;
    LatencyEncodingSynapse* s3 = new LatencyEncodingSynapse(p2, p4, params3);

    LatencyDecodingSynapse_param* params4 = new LatencyDecodingSynapse_param();
    params4->window_length_s = window_length;
    params4->delay_s = 0.003;
    LatencyDecodingSynapse* s4 = new LatencyDecodingSynapse(p4, p5, params4);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);
    n.add(s3);
    n.add(s4);

    cout << (long)s2 << endl;
    cout << (long)s4 << endl;
    cout << (long)p3 << endl;
    cout << (long)p4 << endl;

    // Run the network for 1 second
    n.run(10.0);
    
    return 0;
}